

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.hpp
# Opt level: O0

void __thiscall Omega_h::MetricEdgeLengths<1,_1>::~MetricEdgeLengths(MetricEdgeLengths<1,_1> *this)

{
  MetricEdgeLengths<3,_3> *this_local;
  
  Read<double>::~Read((Read<double> *)(this + 0x10));
  Read<double>::~Read((Read<double> *)this);
  return;
}

Assistant:

MetricEdgeLengths(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}